

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Maxi(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  char *pcVar3;
  uint local_48;
  uint local_44;
  int fVerbose;
  int fSim;
  int nTimeOut;
  int nWords;
  int nFrames;
  int c;
  Vec_Int_t *vTemp;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  nTimeOut = 5;
  fSim = 1000;
  fVerbose = 0;
  local_44 = 0;
  local_48 = 0;
  vTemp = (Vec_Int_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
LAB_002bffdd:
  do {
    iVar1 = Extra_UtilGetopt(argv_local._4_4_,(char **)vTemp,"FWTsvh");
    if (iVar1 == -1) {
      if (pAStack_18->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Maxi(): There is no AIG.\n");
        return 0;
      }
      iVar1 = Gia_ManRegNum(pAStack_18->pGia);
      if (iVar1 == 0) {
        Abc_Print(-1,"Abc_CommandAbc9Maxi(): AIG is combinational.\n");
        return 0;
      }
      _nFrames = pAStack_18->pGia->vInitClasses;
      pVVar2 = Gia_ManMaxiTest(pAStack_18->pGia,_nFrames,nTimeOut,fSim,fVerbose,local_44,local_48);
      pAStack_18->pGia->vInitClasses = pVVar2;
      Vec_IntFreeP((Vec_Int_t **)&nFrames);
      return 0;
    }
    switch(iVar1) {
    case 0x46:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_002c023b;
      }
      nTimeOut = atoi(*(char **)(&vTemp->nCap + (long)globalUtilOptind * 2));
      iVar1 = nTimeOut;
      break;
    default:
      goto LAB_002c023b;
    case 0x54:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_002c023b;
      }
      fVerbose = atoi(*(char **)(&vTemp->nCap + (long)globalUtilOptind * 2));
      iVar1 = fVerbose;
      break;
    case 0x57:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
        goto LAB_002c023b;
      }
      fSim = atoi(*(char **)(&vTemp->nCap + (long)globalUtilOptind * 2));
      iVar1 = fSim;
      break;
    case 0x68:
      goto LAB_002c023b;
    case 0x73:
      local_44 = local_44 ^ 1;
      goto LAB_002bffdd;
    case 0x76:
      local_48 = local_48 ^ 1;
      goto LAB_002bffdd;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_002c023b:
      Abc_Print(-2,"usage: &maxi [-FWT num] [-svh]\n");
      Abc_Print(-2,"\t         experimental procedure\n");
      Abc_Print(-2,"\t-F num : the number of timeframes [default = %d]\n",(ulong)(uint)nTimeOut);
      Abc_Print(-2,"\t-W num : the number of machine words [default = %d]\n",(ulong)(uint)fSim);
      Abc_Print(-2,"\t-T num : approximate global runtime limit in seconds [default = %d]\n",
                (ulong)(uint)fVerbose);
      pcVar3 = "no";
      if (local_44 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggles using ternary simulation [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (local_48 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Maxi( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Vec_Int_t * Gia_ManMaxiTest( Gia_Man_t * p, Vec_Int_t * vInit, int nFrames, int nWords, int nTimeOut, int fSim, int fVerbose );
    Vec_Int_t * vTemp;
    int c, nFrames = 5, nWords = 1000, nTimeOut = 0, fSim = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FWTsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeOut < 0 )
                goto usage;
            break;
        case 's':
            fSim ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Maxi(): There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Maxi(): AIG is combinational.\n" );
        return 0;
    }
    pAbc->pGia->vInitClasses = Gia_ManMaxiTest( pAbc->pGia, vTemp = pAbc->pGia->vInitClasses, nFrames, nWords, nTimeOut, fSim, fVerbose );
    Vec_IntFreeP( &vTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &maxi [-FWT num] [-svh]\n" );
    Abc_Print( -2, "\t         experimental procedure\n" );
    Abc_Print( -2, "\t-F num : the number of timeframes [default = %d]\n",                    nFrames );
    Abc_Print( -2, "\t-W num : the number of machine words [default = %d]\n",                 nWords );
    Abc_Print( -2, "\t-T num : approximate global runtime limit in seconds [default = %d]\n", nTimeOut );
    Abc_Print( -2, "\t-s     : toggles using ternary simulation [default = %s]\n",            fSim?     "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n",        fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}